

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestcase.cpp
# Opt level: O0

char * toStringFp(double t,int digits10)

{
  int iVar1;
  char *__s;
  char *pcVar2;
  uint in_EDI;
  double in_XMM0_Qa;
  char *msg;
  
  __s = (char *)operator_new__(0x80);
  iVar1 = qFpClassify(in_XMM0_Qa);
  if (iVar1 == 0) {
    qstrncpy(__s,"nan",0x80);
  }
  else if (iVar1 == 1) {
    pcVar2 = "inf";
    if (in_XMM0_Qa < 0.0) {
      pcVar2 = "-inf";
    }
    qstrncpy(__s,pcVar2,0x80);
  }
  else {
    snprintf(__s,0x80,"%.*g (%a)",in_XMM0_Qa,in_XMM0_Qa,(ulong)in_EDI);
  }
  return __s;
}

Assistant:

static char *toStringFp(double t, int digits10)
{
    char *msg = new char[128];
    switch (qFpClassify(t)) {
    case FP_INFINITE:
        qstrncpy(msg, (t < 0 ? "-inf" : "inf"), 128);
        break;
    case FP_NAN:
        qstrncpy(msg, "nan", 128);
        break;
    default:
        std::snprintf(msg, 128, "%.*g (%a)", digits10, t, t);
        break;
    }
    return msg;
}